

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O3

void zzDoubleMod_fast(word *b,word *a,word *mod,size_t n)

{
  word wVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  
  if (n != 0) {
    sVar4 = 0;
    uVar5 = 0;
    do {
      uVar2 = a[sVar4];
      wVar1 = uVar5 + uVar2 * 2;
      uVar5 = uVar2 >> 0x3f;
      b[sVar4] = wVar1;
      sVar4 = sVar4 + 1;
    } while (n != sVar4);
    if ((long)uVar2 < 0) goto LAB_00135349;
  }
  iVar3 = wwCmp(b,mod,n);
  if (iVar3 < 0) {
    return;
  }
LAB_00135349:
  zzSub2(b,mod,n);
  return;
}

Assistant:

void FAST(zzDoubleMod)(word b[], const word a[], const word mod[], size_t n)
{
	register word carry = 0;
	register word hi;
	size_t i;
	// pre
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	// b <- a * 2
	for (i = 0; i < n; ++i)
		hi = a[i] >> (B_PER_W - 1),
		b[i] = a[i] << 1 | carry,
		carry = hi;
	// sub mod
	if (carry || wwCmp(b, mod, n) >= 0)
		zzSub2(b, mod, n);
	// очистка
	hi = carry = 0;
}